

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

string * __thiscall cs222::Symbol::getName_abi_cxx11_(string *__return_storage_ptr__,Symbol *this)

{
  Symbol *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string Symbol::getName() const
    {
        return name;
    }